

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::RpcDumper::Sender::~Sender(Sender *this)

{
  Sender *pSVar1;
  HashBucket *pHVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Entry *pEVar5;
  RemoveConst<kj::HashMap<unsigned_int,_capnp::Schema>::Entry> *pRVar6;
  Entry *pEVar7;
  Sender *p;
  
  pSVar1 = (this->partner).ptr;
  if (pSVar1 != (Sender *)0x0) {
    (pSVar1->partner).ptr = (Sender *)0x0;
  }
  pHVar2 = (this->returnTypes).table.indexes.buckets.ptr;
  if (pHVar2 != (HashBucket *)0x0) {
    sVar3 = (this->returnTypes).table.indexes.buckets.size_;
    (this->returnTypes).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->returnTypes).table.indexes.buckets.size_ = 0;
    pAVar4 = (this->returnTypes).table.indexes.buckets.disposer;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pHVar2,8,sVar3,sVar3,0);
  }
  pEVar5 = (this->returnTypes).table.rows.builder.ptr;
  if (pEVar5 != (Entry *)0x0) {
    pRVar6 = (this->returnTypes).table.rows.builder.pos;
    pEVar7 = (this->returnTypes).table.rows.builder.endPtr;
    (this->returnTypes).table.rows.builder.ptr = (Entry *)0x0;
    (this->returnTypes).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<unsigned_int,_capnp::Schema>::Entry> *)0x0;
    (this->returnTypes).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar4 = (this->returnTypes).table.rows.builder.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pEVar5,0x10,(long)pRVar6 - (long)pEVar5 >> 4,(long)pEVar7 - (long)pEVar5 >> 4,
               0);
    return;
  }
  return;
}

Assistant:

~Sender() noexcept(false) {
      KJ_IF_SOME(p, partner) {
        p.partner = kj::none;
      }
    }